

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void vk::BinaryRegistryDetail::BinaryIndexHashImpl_delete
               (BinaryIndexHashImpl *hash,ProgramBinary *key)

{
  deUint32 dVar1;
  uint uVar2;
  deBool dVar3;
  BinaryIndexHashImplSlot *local_40;
  BinaryIndexHashImplSlot *lastSlot;
  BinaryIndexHashImplSlot *pBStack_30;
  int elemNdx;
  BinaryIndexHashImplSlot *prevSlot;
  BinaryIndexHashImplSlot *slot;
  int slotNdx;
  ProgramBinary *key_local;
  BinaryIndexHashImpl *hash_local;
  
  pBStack_30 = (BinaryIndexHashImplSlot *)0x0;
  dVar1 = anon_unknown_8::binaryHash(key);
  uVar2 = dVar1 & hash->slotTableSize - 1U;
  prevSlot = hash->slotTable[(int)uVar2];
  do {
    for (lastSlot._4_4_ = 0; lastSlot._4_4_ < prevSlot->numUsed; lastSlot._4_4_ = lastSlot._4_4_ + 1
        ) {
      dVar3 = anon_unknown_8::binaryEqual(prevSlot->keys[lastSlot._4_4_],key);
      if (dVar3 != 0) {
        for (local_40 = prevSlot; local_40->nextSlot != (BinaryIndexHashImplSlot *)0x0;
            local_40 = local_40->nextSlot) {
          pBStack_30 = local_40;
        }
        prevSlot->keys[lastSlot._4_4_] = local_40->keys[local_40->numUsed + -1];
        prevSlot->values[lastSlot._4_4_] = local_40->values[local_40->numUsed + -1];
        local_40->numUsed = local_40->numUsed + -1;
        if (local_40->numUsed == 0) {
          if (pBStack_30 == (BinaryIndexHashImplSlot *)0x0) {
            hash->slotTable[(int)uVar2] = (BinaryIndexHashImplSlot *)0x0;
          }
          else {
            pBStack_30->nextSlot = (BinaryIndexHashImplSlot *)0x0;
          }
          local_40->nextSlot = hash->slotFreeList;
          hash->slotFreeList = local_40;
        }
        hash->numElements = hash->numElements + -1;
        return;
      }
    }
    pBStack_30 = prevSlot;
    prevSlot = prevSlot->nextSlot;
  } while( true );
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}